

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Gia_Man_t * Gia_QbfCofactor(Gia_Man_t *p,int nPars,Vec_Int_t *vValues,Vec_Int_t *vParMap)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_01;
  bool bVar6;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vParMap_local;
  Vec_Int_t *vValues_local;
  int nPars_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPiNum(p);
  iVar2 = Vec_IntSize(vValues);
  if (iVar1 != nPars + iVar2) {
    __assert_fail("Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x266,"Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  Gia_ManHashAlloc(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      pGStack_40 = Gia_ManCi(p,local_44);
      bVar6 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if (local_44 < nPars) {
      uVar3 = Gia_ManAppendCi(p_00);
      pGStack_40->Value = uVar3;
      iVar1 = Vec_IntEntry(vParMap,local_44);
      if (iVar1 != -1) {
        uVar3 = Vec_IntEntry(vParMap,local_44);
        pGStack_40->Value = uVar3;
      }
    }
    else {
      uVar3 = Vec_IntEntry(vValues,local_44 - nPars);
      pGStack_40->Value = uVar3;
    }
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    bVar6 = false;
    if (local_44 < p->nObjs) {
      pGStack_40 = Gia_ManObj(p,local_44);
      bVar6 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjIsAnd(pGStack_40);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(pGStack_40);
      iVar2 = Gia_ObjFanin1Copy(pGStack_40);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      pGStack_40->Value = uVar3;
    }
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_44 < iVar1) {
      pGStack_40 = Gia_ManCo(p,local_44);
      bVar6 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_40);
    uVar3 = Gia_ManAppendCo(p_00,iVar1);
    pGStack_40->Value = uVar3;
    local_44 = local_44 + 1;
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  if (iVar1 != nPars) {
    __assert_fail("Gia_ManPiNum(pNew) == nPars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x27a,"Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_QbfCofactor( Gia_Man_t * p, int nPars, Vec_Int_t * vValues, Vec_Int_t * vParMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        if ( i < nPars )
        {
            pObj->Value = Gia_ManAppendCi(pNew);
            if ( Vec_IntEntry(vParMap, i) != -1 )
                pObj->Value = Vec_IntEntry(vParMap, i);
        }
        else
            pObj->Value = Vec_IntEntry(vValues, i - nPars);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == nPars );
    return pNew;
}